

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# footprinttobin.cpp
# Opt level: O1

void __thiscall FootprintToBin::WriteBinFootprintFile(FootprintToBin *this)

{
  pointer *ppEVar1;
  uint uVar2;
  iterator __position;
  EventRow er;
  EventRow local_c;
  
  local_c.intensity_bin_id = (this->super_ValidateFootprint).fr_.super_EventRow.intensity_bin_id;
  uVar2 = *(uint *)&(this->super_ValidateFootprint).field_0x3074;
  if (local_c.intensity_bin_id <= (int)uVar2) {
    local_c.areaperil_id = (this->super_ValidateFootprint).fr_.super_EventRow.areaperil_id;
    local_c.probability = (this->super_ValidateFootprint).fr_.super_EventRow.probability;
    this->rowCount_ = this->rowCount_ + 1;
    if (this->zip_ == false) {
      fwrite(&local_c,0xc,1,(FILE *)this->fileOutBin_);
    }
    else {
      __position._M_current =
           (this->eventRows_).super__Vector_base<EventRow,_std::allocator<EventRow>_>._M_impl.
           super__Vector_impl_data._M_finish;
      if (__position._M_current ==
          (this->eventRows_).super__Vector_base<EventRow,_std::allocator<EventRow>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<EventRow,std::allocator<EventRow>>::_M_realloc_insert<EventRow_const&>
                  ((vector<EventRow,std::allocator<EventRow>> *)&this->eventRows_,__position,
                   &local_c);
      }
      else {
        (__position._M_current)->probability = local_c.probability;
        (__position._M_current)->areaperil_id = local_c.areaperil_id;
        (__position._M_current)->intensity_bin_id = local_c.intensity_bin_id;
        ppEVar1 = &(this->eventRows_).super__Vector_base<EventRow,_std::allocator<EventRow>_>.
                   _M_impl.super__Vector_impl_data._M_finish;
        *ppEVar1 = *ppEVar1 + 1;
      }
    }
    return;
  }
  fprintf(_stderr,
          "ERROR: Maximum intensity bin index of %d in header is less than that of %d in line %d:\n%s\n"
          ,(ulong)uVar2,(ulong)(uint)local_c.intensity_bin_id,
          (ulong)(uint)(this->super_ValidateFootprint).super_Validate.lineno_,
          &(this->super_ValidateFootprint).super_Validate);
  exit(1);
}

Assistant:

void FootprintToBin::WriteBinFootprintFile() {

  // Check that intensity bin ID from file does not exceed maximum in header
  if (fr_.intensity_bin_id > maxIntensityBinIdx_) {
    fprintf(stderr, "ERROR: Maximum intensity bin index of %d in header is"
		    " less than that of %d in line %d:\n%s\n",
	    maxIntensityBinIdx_, fr_.intensity_bin_id, lineno_, line_);
    exit(EXIT_FAILURE);
  }
	

  EventRow er = { fr_.areaperil_id, fr_.intensity_bin_id, fr_.probability };
  ++rowCount_;   // Increment row counter

  // Write binary footprint file if no zipped output requested
  if (!zip_) {

    fwrite(&er, sizeof(er), 1, fileOutBin_);
    return;

  }

  // Otherwise, store in vector
  eventRows_.push_back(er);

}